

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warshall.c
# Opt level: O0

void reflexive_transitive_closure(uint *R,int n)

{
  int iVar1;
  uint *relend;
  uint *rp;
  uint mask;
  int rowsize;
  int n_local;
  uint *R_local;
  
  transitive_closure(R,n);
  iVar1 = (n + 0x1f) / 0x20;
  rp._4_4_ = 1;
  for (relend = R; relend < R + n * iVar1; relend = relend + iVar1) {
    *relend = rp._4_4_ | *relend;
    rp._4_4_ = rp._4_4_ << 1;
    if (rp._4_4_ == 0) {
      rp._4_4_ = 1;
      relend = relend + 1;
    }
  }
  return;
}

Assistant:

void reflexive_transitive_closure(unsigned *R, int n)
{
    register int rowsize;
    register unsigned mask;
    register unsigned *rp;
    register unsigned *relend;

    transitive_closure(R, n);

    rowsize = WORDSIZE(n);
    relend = R + n*rowsize;

    mask = 1;
    rp = R;
    while (rp < relend)
    {
	*rp |= mask;
	mask <<= 1;
	if (mask == 0)
	{
	    mask = 1;
	    rp++;
	}

	rp += rowsize;
    }
}